

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void use_item_common(tgestate_t *state,item_t item)

{
  byte bVar1;
  uint8_t uVar2;
  int iVar3;
  doorindex_t *pdVar4;
  byte bVar5;
  long lVar6;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,item) != 0xff) {
    (state->saved_mappos).pos16.w = state->vischars[0].mi.mappos.w;
    *(undefined4 *)&state->saved_mappos = *(undefined4 *)&state->vischars[0].mi.mappos;
    if ((0xe090UL >> ((ulong)item & 0x3f) & 1) == 0) {
      switch((&use_item_common::item_actions_jump_table)[item]) {
      case (undefined *)0x10616f:
        bVar5 = (state->hero_mappos).v;
        lVar6 = 0;
        break;
      case (undefined *)0x106237:
        if (state->room_index == '2') {
          iVar3 = get_roomdef(state,'2',2);
          if (iVar3 != 0xff) {
            set_roomdef(state,'2',2,0xff);
            set_roomdef(state,'2',0x17,0);
            setup_room(state);
            choose_game_window_attributes(state);
            plot_interior_tiles(state);
            bVar5 = 0x66;
            if (state->morale < 0x66) {
              bVar5 = state->morale;
            }
            state->morale = bVar5 + 10;
            increase_score(state,'2');
            return;
          }
        }
        return;
      case (undefined *)0x1062c7:
        pdVar4 = get_nearest_door(state);
        if (pdVar4 != (doorindex_t *)0x0) {
          state->ptr_to_door_being_lockpicked = pdVar4;
          state->player_locked_out_until = state->game_counter + 0xff;
          state->vischars[0].flags = '\x01';
          queue_message(state,message_PICKING_THE_LOCK);
          return;
        }
        return;
      case (undefined *)0x106301:
        if ((0xfb < (byte)((state->hero_mappos).u + 0x93)) &&
           (0xfd < (byte)((state->hero_mappos).v + 0xb5))) {
          if (state->vischars[0].mi.sprite != sprites + 0x16) {
            solitary(state);
            return;
          }
          bVar5 = 0x66;
          if (state->morale < 0x66) {
            bVar5 = state->morale;
          }
          state->morale = bVar5 + 10;
          increase_score(state,'2');
          state->vischars[0].room = '\0';
          state->IY = state->vischars;
          transition(state,&action_papers::outside_main_gate);
          return;
        }
        return;
      }
      do {
        if (((&walls[0xc].miny)[lVar6] <= bVar5) && (bVar5 < (&walls[0xc].maxy)[lVar6])) {
          bVar1 = (state->hero_mappos).u;
          if (bVar1 == (&walls[0xc].maxx)[lVar6]) {
            uVar2 = '\x04';
            goto LAB_001061f0;
          }
          if (bVar1 - 1 == (uint)(&walls[0xc].maxx)[lVar6]) {
            uVar2 = '\x06';
            goto LAB_001061f0;
          }
        }
        lVar6 = lVar6 + 6;
      } while ((char)lVar6 != '\x18');
      bVar1 = (state->hero_mappos).u;
      lVar6 = 0;
      do {
        if (((&walls[0x10].minx)[lVar6] <= bVar1) && (bVar1 < (&walls[0x10].maxx)[lVar6])) {
          if (bVar5 == (&walls[0x10].miny)[lVar6]) {
            uVar2 = '\x05';
LAB_001061f0:
            state->vischars[0].direction = uVar2;
            state->vischars[0].input = 0x80;
            state->vischars[0].flags = '\x02';
            state->vischars[0].mi.mappos.w = 0xc;
            state->vischars[0].mi.sprite = sprites + 2;
            state->player_locked_out_until = state->game_counter + '`';
            queue_message(state,message_CUTTING_THE_WIRE);
            return;
          }
          if (bVar5 - 1 == (uint)(&walls[0x10].miny)[lVar6]) {
            uVar2 = '\a';
            goto LAB_001061f0;
          }
        }
        lVar6 = lVar6 + 6;
        if ((char)lVar6 == '\x12') {
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void use_item_common(tgestate_t *state, item_t item)
{
  /**
   * $7B16: Item actions jump table.
   */
  static const item_action_t item_actions_jump_table[item__LIMIT] =
  {
    action_wiresnips,
    action_shovel,
    action_lockpick,
    action_papers,
    NULL,
    action_bribe,
    action_uniform,
    NULL,
    action_poison,
    action_red_key,
    action_yellow_key,
    action_green_key,
    action_red_cross_parcel,
    NULL,
    NULL,
    NULL,
  };

  assert(state != NULL);

  if (item == item_NONE)
    return;

  ASSERT_ITEM_VALID(item);

  memcpy(&state->saved_mappos,
         &state->vischars[0].mi.mappos,
          sizeof(mappos16_t));

  /* Conv: In the original game the action jumps to a RET for action-less
   * items. We use a NULL instead. */
  if (item_actions_jump_table[item])
    item_actions_jump_table[item](state);
}